

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rosout_appender.cpp
# Opt level: O0

double __thiscall miniros::ROSOutAppender::log(ROSOutAppender *this,double __x)

{
  char *pcVar1;
  bool bVar2;
  TimeBase<miniros::Time,_miniros::Duration> this_00;
  element_type *peVar3;
  string *__a;
  char *in_RCX;
  char *in_RDX;
  int in_ESI;
  char *in_R8;
  _line_type in_R9D;
  double extraout_XMM0_Qa;
  scoped_lock<std::mutex> lock;
  MasterLinkPtr master;
  LogPtr msg;
  TopicManager *in_stack_ffffffffffffff18;
  scoped_lock<std::mutex> *in_stack_ffffffffffffff20;
  value_type *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  _line_type _Var4;
  undefined1 local_89 [33];
  __shared_ptr local_68 [32];
  TimeBase<miniros::Time,_miniros::Duration> local_48;
  _line_type local_2c;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_c;
  ROSOutAppender *local_8;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = this;
  std::make_shared<rosgraph_msgs::Log_<std::allocator<void>>>();
  this_00 = (TimeBase<miniros::Time,_miniros::Duration>)Time::now();
  local_48 = this_00;
  peVar3 = std::
           __shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x49ebd6);
  (peVar3->header).stamp.super_TimeBase<miniros::Time,_miniros::Duration> = local_48;
  if (local_c == 0) {
    peVar3 = std::
             __shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x49ebf9);
    peVar3->level = '\x01';
  }
  else if (local_c == 1) {
    peVar3 = std::
             __shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x49ec32);
    peVar3->level = '\x02';
  }
  else if (local_c == 2) {
    peVar3 = std::
             __shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x49ec4f);
    peVar3->level = '\x04';
  }
  else if (local_c == 3) {
    peVar3 = std::
             __shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x49ec6c);
    peVar3->level = '\b';
  }
  else if (local_c == 4) {
    peVar3 = std::
             __shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x49ec89);
    peVar3->level = '\x10';
  }
  __a = this_node::getName_abi_cxx11_();
  peVar3 = std::
           __shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x49ecae);
  std::__cxx11::string::operator=((string *)&peVar3->name,(string *)__a);
  pcVar1 = local_18;
  peVar3 = std::
           __shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x49ecdb);
  std::__cxx11::string::operator=((string *)&peVar3->msg,pcVar1);
  peVar3 = std::
           __shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x49ed08);
  std::__cxx11::string::operator=((string *)&peVar3->file,local_20);
  peVar3 = std::
           __shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x49ed35);
  std::__cxx11::string::operator=((string *)&peVar3->function,local_28);
  peVar3 = std::
           __shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x49ed63);
  peVar3->line = local_2c;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->topic_manager_);
  if (bVar2) {
    std::__shared_ptr_access<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x49ed95);
    TopicManager::getMasterLink(in_stack_ffffffffffffff18);
    _Var4 = local_2c;
  }
  else {
    std::shared_ptr<miniros::MasterLink>::shared_ptr((shared_ptr<miniros::MasterLink> *)0x49edb6);
    _Var4 = local_2c;
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool(local_68);
  if (bVar2) {
    in_stack_ffffffffffffff20 =
         (scoped_lock<std::mutex> *)
         std::__shared_ptr_access<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x49edd9);
    in_stack_ffffffffffffff28 = (value_type *)local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)this,(allocator<char> *)__a);
    MasterLink::getCached
              ((MasterLink *)in_stack_ffffffffffffff20,(string *)in_stack_ffffffffffffff18,
               (bool *)0x49ee20);
    std::__cxx11::string::~string((string *)(local_89 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_89);
  }
  if ((this->disable_topics_ & 1U) == 0) {
    std::
    __shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x49ee96);
    this_node::getAdvertisedTopics((V_string *)0x49eea5);
  }
  if ((local_c == 4) || (local_c == 3)) {
    std::__cxx11::string::operator=((string *)&this->last_error_,local_18);
  }
  std::scoped_lock<std::mutex>::scoped_lock
            (in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->subs_mutex_);
  std::
  vector<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>,_std::allocator<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_>_>
  ::push_back((vector<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>,_std::allocator<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_>_>
               *)CONCAT44(_Var4,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28);
  std::condition_variable::notify_all();
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x49ef35);
  std::shared_ptr<miniros::MasterLink>::~shared_ptr((shared_ptr<miniros::MasterLink> *)0x49ef42);
  std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>::~shared_ptr
            ((shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_> *)0x49ef4f);
  return extraout_XMM0_Qa;
}

Assistant:

void ROSOutAppender::log(::miniros::console::Level level, const char* str, const char* file, const char* function, int line)
{
  rosgraph_msgs::LogPtr msg(std::make_shared<rosgraph_msgs::Log>());

  msg->header.stamp = miniros::Time::now();
  if (level == miniros::console::Level::Debug)
  {
    msg->level = rosgraph_msgs::Log::DEBUG;
  }
  else if (level == miniros::console::Level::Info)
  {
    msg->level = rosgraph_msgs::Log::INFO;
  }
  else if (level == miniros::console::Level::Warn)
  {
    msg->level = rosgraph_msgs::Log::WARN;
  }
  else if (level == miniros::console::Level::Error)
  {
    msg->level = rosgraph_msgs::Log::ERROR;
  }
  else if (level == miniros::console::Level::Fatal)
  {
    msg->level = rosgraph_msgs::Log::FATAL;
  }
  msg->name = this_node::getName();
  msg->msg = str;
  msg->file = file;
  msg->function = function;
  msg->line = line;

  MasterLinkPtr master = topic_manager_ ? topic_manager_->getMasterLink() : MasterLinkPtr();
  // check parameter server/cache for omit_topics flag
  // the same parameter is checked in rosout.py for the same purpose
  if (master)
    master->getCached("/rosout_disable_topics_generation", disable_topics_);

  if (!disable_topics_) {
    this_node::getAdvertisedTopics(msg->topics);
  }

  if (level == ::miniros::console::Level::Fatal || level == ::miniros::console::Level::Error)
  {
    last_error_ = str;
  }

  std::scoped_lock<std::mutex> lock(queue_mutex_);
  log_queue_.push_back(msg);
  queue_condition_.notify_all();
}